

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

void Rtm_ObjMarkAutoBwd_rec(Rtm_Obj_t *pObj)

{
  Rtm_Obj_t *pObj_00;
  int local_1c;
  int i;
  Rtm_Obj_t *pFanin;
  Rtm_Obj_t *pObj_local;
  
  if ((*(uint *)&pObj->field_0x8 >> 4 & 1) == 0) {
    *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0xffffffef | 0x10;
    for (local_1c = 0; local_1c < (int)(*(uint *)&pObj->field_0x8 >> 7 & 0xff);
        local_1c = local_1c + 1) {
      pObj_00 = Rtm_ObjFanin(pObj,local_1c);
      Rtm_ObjMarkAutoBwd_rec(pObj_00);
    }
  }
  return;
}

Assistant:

void Rtm_ObjMarkAutoBwd_rec( Rtm_Obj_t * pObj )
{
    Rtm_Obj_t * pFanin;
    int i;
    if ( pObj->fAuto )
        return;
    pObj->fAuto = 1;
    Rtm_ObjForEachFanin( pObj, pFanin, i )
        Rtm_ObjMarkAutoBwd_rec( pFanin );
}